

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O0

void IoTHubTransportHttp_DoWork(TRANSPORT_LL_HANDLE handle)

{
  HTTPTRANSPORT_PERDEVICE_DATA *deviceData;
  HTTPTRANSPORT_PERDEVICE_DATA *pHVar1;
  undefined8 *puVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l;
  HTTPTRANSPORT_PERDEVICE_DATA *perDeviceItem;
  size_t i;
  size_t deviceListSize;
  IOTHUB_DEVICE_HANDLE *listItem;
  HTTPTRANSPORT_HANDLE_DATA *handleData;
  TRANSPORT_LL_HANDLE handle_local;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"IoTHubTransportHttp_DoWork",0x83d,1,"Invalid Argument NULL call on DoWork.");
    }
  }
  else {
    pHVar1 = (HTTPTRANSPORT_PERDEVICE_DATA *)VECTOR_size(*(VECTOR_HANDLE *)((long)handle + 0x18));
    for (perDeviceItem = (HTTPTRANSPORT_PERDEVICE_DATA *)0x0; perDeviceItem < pHVar1;
        perDeviceItem = (HTTPTRANSPORT_PERDEVICE_DATA *)((long)&perDeviceItem->transportHandle + 1))
    {
      puVar2 = (undefined8 *)
               VECTOR_element(*(VECTOR_HANDLE *)((long)handle + 0x18),(size_t)perDeviceItem);
      deviceData = (HTTPTRANSPORT_PERDEVICE_DATA *)*puVar2;
      DoEvent((HTTPTRANSPORT_HANDLE_DATA *)handle,deviceData);
      DoMessages((HTTPTRANSPORT_HANDLE_DATA *)handle,deviceData);
    }
  }
  return;
}

Assistant:

static void IoTHubTransportHttp_DoWork(TRANSPORT_LL_HANDLE handle)
{
    if (handle != NULL)
    {
        HTTPTRANSPORT_HANDLE_DATA* handleData = (HTTPTRANSPORT_HANDLE_DATA*)handle;
        IOTHUB_DEVICE_HANDLE* listItem;
        size_t deviceListSize = VECTOR_size(handleData->perDeviceList);
        for (size_t i = 0; i < deviceListSize; i++)
        {
            listItem = (IOTHUB_DEVICE_HANDLE *)VECTOR_element(handleData->perDeviceList, i);
            HTTPTRANSPORT_PERDEVICE_DATA* perDeviceItem = *(HTTPTRANSPORT_PERDEVICE_DATA**)(listItem);
            DoEvent(handleData, perDeviceItem);
            DoMessages(handleData, perDeviceItem);
        }
    }
    else
    {
        LogError("Invalid Argument NULL call on DoWork.");
    }
}